

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

int socketSet(char *where,mpt_fdmode *mode,_func_int_varargs *operation)

{
  uint16_t uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  char cVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  int *piVar8;
  char *pcVar9;
  char *__service;
  char *__name;
  addrinfo *paVar10;
  undefined1 uVar11;
  addrinfo *res;
  sockaddr_un addr;
  
  cVar4 = mode->family;
  if (((cVar4 == '\0') || (cVar4 == '\n')) || (cVar4 == '\x02')) {
    if ((cVar4 == '\x02') || (*where != '[')) {
      pcVar9 = strrchr(where,0x3a);
      if (pcVar9 == (char *)0x0) {
        pcVar9 = (char *)0x0;
        cVar4 = '\0';
        __service = (char *)0x0;
      }
      else {
        cVar4 = *pcVar9;
        *pcVar9 = '\0';
        __service = pcVar9 + 1;
      }
    }
    else {
      where = where + 1;
      pcVar9 = strchr(where,0x5d);
      if (pcVar9 == (char *)0x0) {
        piVar8 = __errno_location();
        *piVar8 = 0x5f;
        return -2;
      }
      cVar4 = *pcVar9;
      *pcVar9 = '\0';
      __service = (char *)0x0;
      if (pcVar9[1] == ':') {
        __service = pcVar9 + 2;
      }
    }
    addr.sun_path[0x1e] = '\0';
    addr.sun_path[0x1f] = '\0';
    addr.sun_path[0x20] = '\0';
    addr.sun_path[0x21] = '\0';
    addr.sun_path[0x22] = '\0';
    addr.sun_path[0x23] = '\0';
    addr.sun_path[0x24] = '\0';
    addr.sun_path[0x25] = '\0';
    addr.sun_path[0x26] = '\0';
    addr.sun_path[0x27] = '\0';
    addr.sun_path[0x28] = '\0';
    addr.sun_path[0x29] = '\0';
    addr.sun_path[0x2a] = '\0';
    addr.sun_path[0x2b] = '\0';
    addr.sun_path[0x2c] = '\0';
    addr.sun_path[0x2d] = '\0';
    addr.sun_path[0xe] = '\0';
    addr.sun_path[0xf] = '\0';
    addr.sun_path[0x10] = '\0';
    addr.sun_path[0x11] = '\0';
    addr.sun_path[0x12] = '\0';
    addr.sun_path[0x13] = '\0';
    addr.sun_path[0x14] = '\0';
    addr.sun_path[0x15] = '\0';
    addr.sun_path[0x16] = '\0';
    addr.sun_path[0x17] = '\0';
    addr.sun_path[0x18] = '\0';
    addr.sun_path[0x19] = '\0';
    addr.sun_path[0x1a] = '\0';
    addr.sun_path[0x1b] = '\0';
    addr.sun_path[0x1c] = '\0';
    addr.sun_path[0x1d] = '\0';
    uVar1 = (mode->param).file.open;
    uVar11 = (undefined1)(uVar1 >> 8);
    auVar3._4_8_ = (ulong)(CONCAT14(uVar11,(uint)CONCAT12(uVar11,uVar1)) & 0xffffff00ff) &
                   0xffffffff0000ffff;
    auVar3._0_4_ = (int)mode->family;
    auVar3._12_4_ = 0;
    addr._0_16_ = auVar3 << 0x20;
    __name = (char *)0x0;
    if (*where != '\0') {
      __name = where;
    }
    iVar6 = getaddrinfo(__name,__service,(addrinfo *)&addr,(addrinfo **)&res);
    if (cVar4 != '\0' && pcVar9 != (char *)0x0) {
      *pcVar9 = cVar4;
    }
    if (iVar6 == 0) {
      paVar10 = res;
      while (uVar5 = 0xffffffff, paVar10 != (addrinfo *)0x0) {
        cVar4 = (char)paVar10->ai_family;
        mode->family = cVar4;
        uVar5 = paVar10->ai_socktype;
        (mode->param).sock.type = (uint8_t)uVar5;
        uVar2 = paVar10->ai_protocol;
        (mode->param).sock.proto = (uint8_t)uVar2;
        uVar5 = socket((int)cVar4,uVar5 & 0xff,uVar2 & 0xff);
        if (((int)uVar5 < 0) ||
           (iVar6 = (*operation)((ulong)uVar5,paVar10->ai_addr,(ulong)paVar10->ai_addrlen),
           -1 < iVar6)) break;
        paVar10 = paVar10->ai_next;
        piVar8 = __errno_location();
        *piVar8 = 0x5c;
        close(uVar5);
      }
      if (res != (addrinfo *)0x0) {
        freeaddrinfo((addrinfo *)res);
      }
      goto LAB_00103d2f;
    }
    if (iVar6 != -3) {
      if (iVar6 == -0xb) {
        return -1;
      }
      return -3;
    }
  }
  else {
    if (cVar4 != '\x01') {
      piVar8 = __errno_location();
      *piVar8 = 0x5d;
      return -4;
    }
    sVar7 = strlen(where);
    if (sVar7 < 0x6c) {
      uVar5 = socket(1,(uint)(mode->param).sock.type,(uint)(mode->param).sock.proto);
      if ((int)uVar5 < 0) {
        return uVar5;
      }
      addr.sun_family = 1;
      memcpy(addr.sun_path,where,sVar7 + 1);
      iVar6 = (*operation)((ulong)uVar5,&addr,0x6e);
      if (iVar6 < 0) {
        close(uVar5);
        return -1;
      }
LAB_00103d2f:
      mode->stream = (ushort)((mode->param).sock.type == '\x01') * 4 + 3;
      return uVar5;
    }
    piVar8 = __errno_location();
    *piVar8 = 0x22;
  }
  return -2;
}

Assistant:

static int socketSet(const char *where, MPT_STRUCT(fdmode) *mode, int (*operation)())
{
	int len, sock;
	
	/* unix socket */
	if (mode->family == AF_UNIX) {
		struct sockaddr_un addr;
		size_t len;
		
		if ((len = strlen(where)) >= sizeof(addr.sun_path)) {
			errno = ERANGE;
			return -2;
		}
		if ((sock = socket(AF_UNIX, mode->param.sock.type, mode->param.sock.proto)) < 0) {
			return sock;
		}
		addr.sun_family = AF_UNIX;
		memcpy(addr.sun_path, where, len+1);
		if (operation(sock, (struct sockaddr *) &addr, sizeof(addr)) < 0) {
			(void) close(sock);
			return -1;
		}
		mode->stream = MPT_SOCKETFLAG(Read) | MPT_SOCKETFLAG(Write);
		
		if (mode->param.sock.type == SOCK_STREAM) {
			mode->stream |= MPT_SOCKETFLAG(Stream);
		}
	}
	/* ip socket */
	else if (mode->family == AF_INET || mode->family == AF_INET6 || mode->family == AF_UNSPEC) {
		struct addrinfo hints, *res, *curr;
		char *port, *end, save = 0;
		
		if (mode->family != AF_INET && *where == '[') {
			if (!(end = strchr(++where, ']'))) {
				errno = ENOTSUP;
				return -2;
			}
			save = *end;
			*end = 0;
			port = (end[1] == ':') ? end+2 : 0;
		}
		else if ((end = port = strrchr(where, ':'))) {
			save = *end;
			*port++ = 0;
		}
		memset(&hints, 0, sizeof(hints));
		hints.ai_family   = mode->family;
		hints.ai_socktype = mode->param.sock.type;
		hints.ai_protocol = mode->param.sock.proto;
		
		if (!*where) {
			where = 0;
		}
		len = getaddrinfo(where, port, &hints, &res);
		
		if (end && save) {
			*end = save;
		}
		switch (len) {
		  case 0: break;
		  case EAI_AGAIN: return -2;
		  case EAI_SYSTEM: return -1;
		  default: return -3;
		}
		curr = res;
		sock = -1;
		
		while (curr) {
			mode->family           = curr->ai_family;
			mode->param.sock.type  = curr->ai_socktype;
			mode->param.sock.proto = curr->ai_protocol;
			
			if ((sock = socket(mode->family, mode->param.sock.type, mode->param.sock.proto)) < 0) {
				break;
			}
			if (operation(sock, curr->ai_addr, curr->ai_addrlen) >= 0) {
				break;
			}
			curr = curr->ai_next;
			
			errno = ENOPROTOOPT;
			(void) close(sock);
			sock = -1;
		}
		if (res) {
			freeaddrinfo(res);
		}
		mode->stream = MPT_SOCKETFLAG(Read) | MPT_SOCKETFLAG(Write);
		
		if (mode->param.sock.type == SOCK_STREAM) {
			mode->stream |= MPT_SOCKETFLAG(Stream);
		}
	}
	else {
		errno = EPROTONOSUPPORT;
		return -4;
	}
	return sock;
}